

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Environment *this;
  VkDescriptorPool *this_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data;
  RefData<vk::Handle<(vk::HandleType)22>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  allocator<char> local_291;
  string local_290;
  Move<vk::Handle<(vk::HandleType)22>_> local_270;
  RefData<vk::Handle<(vk::HandleType)22>_> local_250;
  undefined1 local_230 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj3;
  RefData<vk::Handle<(vk::HandleType)22>_> local_1f0;
  undefined1 local_1d0 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj2;
  RefData<vk::Handle<(vk::HandleType)22>_> local_190;
  undefined1 local_170 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj1;
  Move<vk::Handle<(vk::HandleType)22>_> local_140;
  RefData<vk::Handle<(vk::HandleType)22>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> obj0;
  Resources res;
  Environment env;
  Parameters *params_local;
  Context *context_local;
  
  this = (Environment *)
         &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
          deleter.m_allocator;
  Environment::Environment(this,context,4);
  this_00 = &obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool;
  DescriptorSet::Resources::Resources((Resources *)this_00,this,params);
  DescriptorSet::create(&local_140,this,(Resources *)this_00,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_device = local_120.deleter.m_device;
  data.deleter.m_pool.m_internal = local_120.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_140);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (Environment *)
             &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_190,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface = local_190.deleter.m_deviceIface;
  data_00.object.m_internal = local_190.object.m_internal;
  data_00.deleter.m_device = local_190.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_190.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_170,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  DescriptorSet::create
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool,
             (Environment *)
             &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,params);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1f0,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  data_01.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_01.object.m_internal = local_1f0.object.m_internal;
  data_01.deleter.m_device = local_1f0.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_1f0.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_1d0,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  DescriptorSet::create
            (&local_270,
             (Environment *)
             &res.descriptorSetLayout.object.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
              deleter.m_allocator,
             (Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,params);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&local_270);
  data_02.deleter.m_deviceIface = local_250.deleter.m_deviceIface;
  data_02.object.m_internal = local_250.object.m_internal;
  data_02.deleter.m_device = local_250.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_250.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_230,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_270);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_230);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_1d0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_170);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"Ok",&local_291);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  DescriptorSet::Resources::~Resources
            ((Resources *)&obj0.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}